

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall SmallArray<const_char_*,_32U>::~SmallArray(SmallArray<const_char_*,_32U> *this)

{
  char **ppcVar1;
  
  ppcVar1 = this->data;
  if (ppcVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (ppcVar1 != (char **)0x0) {
        (*(code *)NULLC::dealloc)(ppcVar1);
      }
    }
    else if (ppcVar1 != (char **)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}